

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::Data
          (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *this,
          Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  pair<int,_bool> pVar4;
  Node<QRhiResource_*,_std::pair<int,_bool>_> *pNVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  R RVar9;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar7 = other->numBuckets;
  sVar8 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar8;
  this->spans = (Span *)0x0;
  RVar9 = allocateSpans(sVar7);
  this->spans = (Span *)RVar9.spans;
  if (RVar9.nSpans != 0) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pSVar2 = other->spans;
      sVar8 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar8 + lVar6];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar7].entries;
          pNVar5 = Span<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::insert
                             (this->spans + sVar7,sVar8);
          pEVar3 = pEVar3 + bVar1;
          pVar4 = *(pair<int,_bool> *)((pEVar3->storage).data + 8);
          pNVar5->key = *(QRhiResource **)(pEVar3->storage).data;
          pNVar5->value = pVar4;
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != 0x80);
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (sVar7 != RVar9.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }